

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SievingPrimes.cpp
# Opt level: O1

int __thiscall primesieve::SievingPrimes::init(SievingPrimes *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  ulong uVar2;
  int extraout_EAX;
  ulong uVar3;
  ulong uVar4;
  long *in_RDX;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  
  lVar1 = *in_RDX;
  uVar2 = *(ulong *)(ctx + 8);
  auVar7._8_4_ = (int)(uVar2 >> 0x20);
  auVar7._0_8_ = uVar2;
  auVar7._12_4_ = 0x45300000;
  dVar6 = (auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  uVar5 = (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
  if (0xfffffffe < uVar5) {
    uVar5 = 0xffffffff;
  }
  uVar3 = uVar5 * 2;
  do {
    uVar4 = uVar5 * uVar5;
    uVar5 = uVar5 - 1;
    uVar3 = uVar3 - 2;
  } while (uVar2 <= uVar4 && uVar4 - uVar2 != 0);
  do {
    uVar5 = uVar5 + 1;
    uVar3 = uVar3 + 2;
  } while (uVar3 < uVar2 - uVar5 * uVar5);
  Erat::init(&this->super_Erat,(EVP_PKEY_CTX *)(lVar1 + 1));
  tinySieve(this);
  return extraout_EAX;
}

Assistant:

void SievingPrimes::init(Erat* erat, PreSieve& preSieve)
{
  Erat::init(preSieve.getMaxPrime() + 1,
             isqrt(erat->getStop()),
             erat->getSieveSize(),
             preSieve);

  tinySieve();
}